

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O3

void __thiscall
tf::UnboundedTaskQueue<void_*>::~UnboundedTaskQueue(UnboundedTaskQueue<void_*> *this)

{
  pointer ppAVar1;
  Array *pAVar2;
  __pointer_type pAVar3;
  pointer ppAVar4;
  
  ppAVar1 = (this->_garbage).
            super__Vector_base<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar4 = (this->_garbage).
                 super__Vector_base<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar4 != ppAVar1;
      ppAVar4 = ppAVar4 + 1) {
    pAVar2 = *ppAVar4;
    if ((pAVar2 != (Array *)0x0) && (pAVar2->S != (atomic<void_*> *)0x0)) {
      operator_delete__(pAVar2->S);
    }
    operator_delete(pAVar2,0x18);
  }
  pAVar3 = (this->_array)._M_b._M_p;
  if ((pAVar3 != (__pointer_type)0x0) && (pAVar3->S != (atomic<void_*> *)0x0)) {
    operator_delete__(pAVar3->S);
  }
  operator_delete(pAVar3,0x18);
  ppAVar4 = (this->_garbage).
            super__Vector_base<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar4 != (pointer)0x0) {
    operator_delete(ppAVar4,(long)(this->_garbage).
                                  super__Vector_base<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar4
                   );
    return;
  }
  return;
}

Assistant:

UnboundedTaskQueue<T>::~UnboundedTaskQueue() {
  for(auto a : _garbage) {
    delete a;
  }
  delete _array.load();
}